

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_interpolate_node(REF_GRID ref_grid,REF_INT node)

{
  REF_INTERP ref_interp;
  REF_MPI pRVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  uint uVar2;
  REF_DBL *pRVar3;
  long lVar4;
  REF_DBL *pRVar5;
  long lVar6;
  uint uVar7;
  REF_DBL RVar8;
  REF_DBL log_m [6];
  REF_DBL bary [4];
  REF_INT nodes [27];
  REF_DBL log_parent_m [4] [6];
  REF_DBL local_1b8 [10];
  REF_INT local_168 [28];
  REF_DBL local_f8 [25];
  
  ref_interp = ref_grid->interp;
  uVar7 = 0;
  uVar2 = 0;
  if (ref_interp != (REF_INTERP)0x0) {
    if (ref_interp->continuously == 0) {
      ref_interp->cell[node] = -1;
      uVar2 = uVar7;
    }
    else {
      pRVar1 = ref_grid->mpi;
      ref_node = ref_interp->from_grid->node;
      ref_cell = (&ref_interp->from_tet)[ref_interp->from_grid->twod != 0];
      uVar2 = ref_interp_locate_node(ref_interp,node);
      if (uVar2 == 0) {
        uVar2 = uVar7;
        if ((ref_interp->cell[node] != -1) && (pRVar1->id == ref_interp->part[node])) {
          uVar2 = ref_cell_nodes(ref_cell,ref_interp->cell[node],local_168);
          if (uVar2 == 0) {
            uVar2 = ref_node_clip_bary4(ref_interp->bary + node * 4,local_1b8 + 6);
            if (uVar2 == 0) {
              uVar2 = ref_cell->node_per;
              if (0 < (int)uVar2) {
                pRVar3 = local_f8;
                lVar6 = 0;
                do {
                  uVar2 = ref_node_metric_get_log(ref_node,local_168[lVar6],pRVar3);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x1fc,"ref_metric_interpolate_node",(ulong)uVar2);
                    return uVar2;
                  }
                  lVar6 = lVar6 + 1;
                  uVar2 = ref_cell->node_per;
                  pRVar3 = pRVar3 + 6;
                } while (lVar6 < (int)uVar2);
              }
              pRVar3 = local_f8;
              local_1b8[4] = 0.0;
              local_1b8[5] = 0.0;
              local_1b8[2] = 0.0;
              local_1b8[3] = 0.0;
              local_1b8[0] = 0.0;
              local_1b8[1] = 0.0;
              lVar6 = 0;
              do {
                if (0 < (int)uVar2) {
                  RVar8 = local_1b8[lVar6];
                  lVar4 = 0;
                  pRVar5 = local_1b8 + 6;
                  do {
                    RVar8 = RVar8 + *pRVar5 * pRVar3[lVar4];
                    pRVar5 = pRVar5 + 1;
                    lVar4 = lVar4 + 6;
                  } while ((ulong)uVar2 * 6 != lVar4);
                  local_1b8[lVar6] = RVar8;
                }
                lVar6 = lVar6 + 1;
                pRVar3 = pRVar3 + 1;
              } while (lVar6 != 6);
              uVar2 = ref_node_metric_set_log(ref_grid->node,node,local_1b8);
              if (uVar2 == 0) {
                uVar2 = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x204,"ref_metric_interpolate_node",(ulong)uVar2,"set interp log met");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x1f9,"ref_metric_interpolate_node",(ulong)uVar2);
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x1f8,"ref_metric_interpolate_node",(ulong)uVar2);
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_metric_interpolate_node(REF_GRID ref_grid,
                                               REF_INT node) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INTERP ref_interp;
  REF_GRID from_grid;
  REF_NODE from_node;
  REF_CELL from_cell;
  REF_DBL log_parent_m[4][6], log_m[6], bary[4];
  REF_INT ibary, im;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  if (NULL == ref_grid_interp(ref_grid)) {
    return REF_SUCCESS;
  }

  ref_interp = ref_grid_interp(ref_grid);
  from_grid = ref_interp_from_grid(ref_interp);
  from_node = ref_grid_node(from_grid);
  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  if (!ref_interp_continuously(ref_interp)) {
    ref_interp_cell(ref_interp, node) = REF_EMPTY; /* mark moved */
    return REF_SUCCESS;
  }

  RAISE(ref_interp_locate_node(ref_interp, node));

  /* location unsuccessful */
  if (REF_EMPTY == ref_interp_cell(ref_interp, node) ||
      ref_mpi_rank(ref_mpi) != ref_interp->part[node])
    return REF_SUCCESS;
  RSS(ref_cell_nodes(from_cell, ref_interp_cell(ref_interp, node), nodes),
      "node needs to be localized");
  RSS(ref_node_clip_bary4(&ref_interp_bary(ref_interp, 0, node), bary), "clip");
  for (ibary = 0; ibary < ref_cell_node_per(from_cell); ibary++)
    RSS(ref_node_metric_get_log(from_node, nodes[ibary], log_parent_m[ibary]),
        "log(parentM)");
  for (im = 0; im < 6; im++) log_m[im] = 0.0;
  for (im = 0; im < 6; im++) {
    for (ibary = 0; ibary < ref_cell_node_per(from_cell); ibary++) {
      log_m[im] += bary[ibary] * log_parent_m[ibary][im];
    }
  }
  RSS(ref_node_metric_set_log(ref_grid_node(ref_grid), node, log_m),
      "set interp log met");

  return REF_SUCCESS;
}